

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  char *pcVar1;
  curl_slist *pcVar2;
  char *pcVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  curl_strdup_callback p_Var7;
  char in_AL;
  int iVar8;
  long *plVar9;
  long *plVar10;
  void **ppvVar11;
  size_t sVar12;
  size_t sVar13;
  char *pcVar14;
  curl_httppost *pcVar15;
  curl_httppost *pcVar16;
  uint uVar17;
  undefined8 in_RCX;
  ulong uVar18;
  curl_httppost **ppcVar19;
  undefined8 in_RDX;
  CURLFORMcode CVar20;
  long lVar21;
  char *pcVar22;
  undefined8 in_R8;
  long *plVar23;
  undefined8 in_R9;
  FormInfo *ptr_1;
  char *pcVar24;
  FormInfo *ptr;
  int *piVar25;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  void **local_160;
  char *local_140;
  ulong local_138;
  char *local_130;
  size_t local_128;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_160 = &arg[0].overflow_arg_area;
  uVar17 = 0x10;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  plVar9 = (long *)(*Curl_ccalloc)(1,0x80);
  if (plVar9 == (long *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  pcVar24 = (char *)0x0;
  piVar25 = (int *)0x0;
  CVar20 = CURL_FORMADD_OK;
  plVar23 = plVar9;
  bVar5 = false;
switchD_00571aa2_caseD_9:
  plVar10 = plVar9;
  if (CVar20 == CURL_FORMADD_OK) {
    if ((bool)(piVar25 != (int *)0x0 & bVar5)) goto code_r0x00571a40;
    uVar18 = (ulong)uVar17;
    if (uVar18 < 0x29) {
      uVar17 = uVar17 + 8;
      ppvVar11 = (void **)((long)local_e8 + uVar18);
    }
    else {
      ppvVar11 = local_160;
      local_160 = local_160 + 1;
    }
    iVar8 = *(int *)ppvVar11;
    if (iVar8 != 0x11) goto LAB_00571a8f;
    pcVar24 = (char *)0x0;
    plVar23 = plVar9;
    pcVar16 = (curl_httppost *)0x0;
    goto LAB_005722b2;
  }
  do {
    if ((char)plVar10[1] == '\x01') {
      if ((void *)*plVar10 != (void *)0x0) {
        (*Curl_cfree)((void *)*plVar10);
        *plVar10 = 0;
      }
      *(undefined1 *)(plVar10 + 1) = 0;
    }
    if ((char)plVar10[4] == '\x01') {
      if ((void *)plVar10[3] != (void *)0x0) {
        (*Curl_cfree)((void *)plVar10[3]);
        plVar10[3] = 0;
      }
      *(undefined1 *)(plVar10 + 4) = 0;
    }
    if ((char)plVar10[7] == '\x01') {
      if ((void *)plVar10[6] != (void *)0x0) {
        (*Curl_cfree)((void *)plVar10[6]);
        plVar10[6] = 0;
      }
      *(undefined1 *)(plVar10 + 7) = 0;
    }
    if ((char)plVar10[0xc] == '\x01') {
      if ((void *)plVar10[0xb] != (void *)0x0) {
        (*Curl_cfree)((void *)plVar10[0xb]);
        plVar10[0xb] = 0;
      }
      *(undefined1 *)(plVar10 + 0xc) = 0;
    }
    plVar23 = plVar10 + 0xf;
    plVar10 = (long *)*plVar23;
  } while ((long *)*plVar23 != (long *)0x0);
  goto LAB_00572270;
code_r0x00571a40:
  iVar8 = *piVar25;
  pcVar24 = *(char **)(piVar25 + 2);
  piVar25 = piVar25 + 4;
  CVar20 = CURL_FORMADD_OK;
  bVar5 = false;
  if (iVar8 == 0x11) goto switchD_00571aa2_caseD_9;
  bVar5 = true;
LAB_00571a8f:
  CVar20 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar14 = pcVar24;
  switch(iVar8) {
  case 2:
    *(byte *)(plVar23 + 8) = *(byte *)(plVar23 + 8) | 4;
  case 1:
    CVar20 = CURL_FORMADD_OPTION_TWICE;
    if (*plVar23 == 0) {
      if (!bVar5) {
        uVar18 = (ulong)uVar17;
        if (uVar18 < 0x29) {
          uVar17 = uVar17 + 8;
          ppvVar11 = (void **)((long)local_e8 + uVar18);
        }
        else {
          ppvVar11 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar14 = (char *)*ppvVar11;
      }
      CVar20 = CURL_FORMADD_NULL;
      if (pcVar14 != (char *)0x0) {
        *plVar23 = (long)pcVar14;
        CVar20 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00571aa2_caseD_9;
  case 3:
    CVar20 = CURL_FORMADD_OPTION_TWICE;
    if (plVar23[2] == 0) {
      if (!bVar5) {
        uVar18 = (ulong)uVar17;
        if (uVar18 < 0x29) {
          uVar17 = uVar17 + 8;
          ppvVar11 = (void **)((long)local_e8 + uVar18);
        }
        else {
          ppvVar11 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar14 = (char *)*ppvVar11;
      }
      plVar23[2] = (long)pcVar14;
      CVar20 = CURL_FORMADD_OK;
    }
    goto switchD_00571aa2_caseD_9;
  case 5:
    *(byte *)(plVar23 + 8) = *(byte *)(plVar23 + 8) | 8;
  case 4:
    CVar20 = CURL_FORMADD_OPTION_TWICE;
    if (plVar23[3] != 0) goto switchD_00571aa2_caseD_9;
    if (!bVar5) {
      uVar18 = (ulong)uVar17;
      if (uVar18 < 0x29) {
        uVar17 = uVar17 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar18);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar11;
    }
    CVar20 = CURL_FORMADD_NULL;
    if (pcVar14 == (char *)0x0) goto switchD_00571aa2_caseD_9;
    break;
  case 6:
    CVar20 = CURL_FORMADD_OPTION_TWICE;
    if (plVar23[5] == 0) {
      if (!bVar5) {
        uVar18 = (ulong)uVar17;
        if (uVar18 < 0x29) {
          uVar17 = uVar17 + 8;
          ppvVar11 = (void **)((long)local_e8 + uVar18);
        }
        else {
          ppvVar11 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar14 = (char *)*ppvVar11;
      }
      plVar23[5] = (long)pcVar14;
      CVar20 = CURL_FORMADD_OK;
    }
    goto switchD_00571aa2_caseD_9;
  case 7:
    CVar20 = CURL_FORMADD_OPTION_TWICE;
    if ((*(byte *)(plVar23 + 8) & 10) != 0) goto switchD_00571aa2_caseD_9;
    if (!bVar5) {
      uVar18 = (ulong)uVar17;
      if (uVar18 < 0x29) {
        uVar17 = uVar17 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar18);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar11;
    }
    CVar20 = CURL_FORMADD_NULL;
    if (pcVar14 == (char *)0x0) goto switchD_00571aa2_caseD_9;
    pcVar14 = (*Curl_cstrdup)(pcVar14);
    plVar23[3] = (long)pcVar14;
    CVar20 = CURL_FORMADD_MEMORY;
    if (pcVar14 == (char *)0x0) goto switchD_00571aa2_caseD_9;
    *(byte *)(plVar23 + 8) = *(byte *)(plVar23 + 8) | 2;
    goto LAB_005721a9;
  case 8:
    CVar20 = CURL_FORMADD_ILLEGAL_ARRAY;
    bVar6 = !bVar5;
    bVar5 = true;
    if (bVar6) {
      uVar18 = (ulong)uVar17;
      if (uVar18 < 0x29) {
        uVar17 = uVar17 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar18);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      piVar25 = (int *)*ppvVar11;
      bVar5 = piVar25 != (int *)0x0;
      CVar20 = (uint)(piVar25 == (int *)0x0) * 3;
    }
  default:
    goto switchD_00571aa2_caseD_9;
  case 10:
    if (!bVar5) {
      uVar18 = (ulong)uVar17;
      if (uVar18 < 0x29) {
        uVar17 = uVar17 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar18);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar11;
    }
    if (plVar23[3] != 0) {
      CVar20 = CURL_FORMADD_OPTION_TWICE;
      if (((*(byte *)(plVar23 + 8) & 1) == 0) ||
         (CVar20 = CURL_FORMADD_NULL, pcVar14 == (char *)0x0)) goto switchD_00571aa2_caseD_9;
      local_140 = (*Curl_cstrdup)(pcVar14);
      CVar20 = CURL_FORMADD_MEMORY;
      if (local_140 == (char *)0x0) goto switchD_00571aa2_caseD_9;
      plVar10 = (long *)(*Curl_ccalloc)(1,0x80);
      if (plVar10 == (long *)0x0) goto LAB_005721b5;
      plVar10[3] = (long)local_140;
      plVar10[8] = 1;
      plVar10[0xf] = plVar23[0xf];
      plVar23[0xf] = (long)plVar10;
      *(undefined1 *)(plVar10 + 4) = 1;
      goto LAB_00571f97;
    }
    CVar20 = CURL_FORMADD_NULL;
    if (pcVar14 == (char *)0x0) goto switchD_00571aa2_caseD_9;
    pcVar14 = (*Curl_cstrdup)(pcVar14);
    plVar23[3] = (long)pcVar14;
    CVar20 = CURL_FORMADD_MEMORY;
    if (pcVar14 == (char *)0x0) goto switchD_00571aa2_caseD_9;
    *(byte *)(plVar23 + 8) = *(byte *)(plVar23 + 8) | 1;
LAB_005721a9:
    *(undefined1 *)(plVar23 + 4) = 1;
    CVar20 = CURL_FORMADD_OK;
    goto switchD_00571aa2_caseD_9;
  case 0xb:
  case 0x10:
    if (!bVar5) {
      uVar18 = (ulong)uVar17;
      if (uVar18 < 0x29) {
        uVar17 = uVar17 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar18);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar11;
    }
    CVar20 = CURL_FORMADD_OPTION_TWICE;
    if (plVar23[0xb] == 0) {
      pcVar14 = (*Curl_cstrdup)(pcVar14);
      plVar23[0xb] = (long)pcVar14;
      CVar20 = CURL_FORMADD_MEMORY;
      if (pcVar14 != (char *)0x0) {
        *(undefined1 *)(plVar23 + 0xc) = 1;
        CVar20 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00571aa2_caseD_9;
  case 0xc:
    *(byte *)(plVar23 + 8) = *(byte *)(plVar23 + 8) | 0x30;
    CVar20 = CURL_FORMADD_OPTION_TWICE;
    if (plVar23[9] != 0) goto switchD_00571aa2_caseD_9;
    if (!bVar5) {
      uVar18 = (ulong)uVar17;
      if (uVar18 < 0x29) {
        uVar17 = uVar17 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar18);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar11;
    }
    CVar20 = CURL_FORMADD_NULL;
    if (pcVar14 == (char *)0x0) goto switchD_00571aa2_caseD_9;
    plVar23[9] = (long)pcVar14;
    break;
  case 0xd:
    CVar20 = CURL_FORMADD_OPTION_TWICE;
    if (plVar23[10] == 0) {
      if (!bVar5) {
        uVar18 = (ulong)uVar17;
        if (uVar18 < 0x29) {
          uVar17 = uVar17 + 8;
          ppvVar11 = (void **)((long)local_e8 + uVar18);
        }
        else {
          ppvVar11 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar14 = (char *)*ppvVar11;
      }
      plVar23[10] = (long)pcVar14;
      CVar20 = CURL_FORMADD_OK;
    }
    goto switchD_00571aa2_caseD_9;
  case 0xe:
    if (!bVar5) {
      uVar18 = (ulong)uVar17;
      if (uVar18 < 0x29) {
        uVar17 = uVar17 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar18);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar11;
    }
    if (plVar23[6] == 0) {
      CVar20 = CURL_FORMADD_NULL;
      if (pcVar14 != (char *)0x0) {
        pcVar14 = (*Curl_cstrdup)(pcVar14);
        plVar23[6] = (long)pcVar14;
        CVar20 = CURL_FORMADD_MEMORY;
        if (pcVar14 != (char *)0x0) {
          *(undefined1 *)(plVar23 + 7) = 1;
          CVar20 = CURL_FORMADD_OK;
        }
      }
      goto switchD_00571aa2_caseD_9;
    }
    CVar20 = CURL_FORMADD_OPTION_TWICE;
    if (((*(byte *)(plVar23 + 8) & 1) == 0) || (CVar20 = CURL_FORMADD_NULL, pcVar14 == (char *)0x0))
    goto switchD_00571aa2_caseD_9;
    local_140 = (*Curl_cstrdup)(pcVar14);
    CVar20 = CURL_FORMADD_MEMORY;
    if (local_140 == (char *)0x0) goto switchD_00571aa2_caseD_9;
    plVar10 = (long *)(*Curl_ccalloc)(1,0x80);
    if (plVar10 == (long *)0x0) {
LAB_005721b5:
      CVar20 = CURL_FORMADD_MEMORY;
      (*Curl_cfree)(local_140);
      goto switchD_00571aa2_caseD_9;
    }
    plVar10[6] = (long)local_140;
    plVar10[8] = 1;
    plVar10[0xf] = plVar23[0xf];
    plVar23[0xf] = (long)plVar10;
    *(undefined1 *)(plVar10 + 7) = 1;
LAB_00571f97:
    CVar20 = CURL_FORMADD_OK;
    plVar23 = plVar10;
    goto switchD_00571aa2_caseD_9;
  case 0xf:
    if (!bVar5) {
      uVar18 = (ulong)uVar17;
      if (uVar18 < 0x29) {
        uVar17 = uVar17 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar18);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar11;
    }
    CVar20 = CURL_FORMADD_OPTION_TWICE;
    if (plVar23[0xe] == 0) {
      plVar23[0xe] = (long)pcVar14;
      CVar20 = CURL_FORMADD_OK;
    }
    goto switchD_00571aa2_caseD_9;
  case 0x13:
    *(byte *)(plVar23 + 8) = *(byte *)(plVar23 + 8) | 0x40;
    CVar20 = CURL_FORMADD_OPTION_TWICE;
    if (plVar23[0xd] != 0) goto switchD_00571aa2_caseD_9;
    if (!bVar5) {
      uVar18 = (ulong)uVar17;
      if (uVar18 < 0x29) {
        uVar17 = uVar17 + 8;
        ppvVar11 = (void **)((long)local_e8 + uVar18);
      }
      else {
        ppvVar11 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar14 = (char *)*ppvVar11;
    }
    CVar20 = CURL_FORMADD_NULL;
    if (pcVar14 == (char *)0x0) goto switchD_00571aa2_caseD_9;
    plVar23[0xd] = (long)pcVar14;
  }
  plVar23[3] = (long)pcVar14;
  CVar20 = CURL_FORMADD_OK;
  goto switchD_00571aa2_caseD_9;
LAB_005722b2:
  p_Var7 = Curl_cstrdup;
  if (*plVar23 == 0) {
    if (pcVar16 == (curl_httppost *)0x0) goto LAB_005725e3;
LAB_005722d1:
    local_138 = plVar23[8];
    CVar20 = CURL_FORMADD_INCOMPLETE;
    if (((((plVar23[5] != 0 & (byte)local_138) != 0) ||
         (uVar17 = (uint)local_138, (uVar17 & 9) == 9)) || ((~uVar17 & 10) == 0)) ||
       ((~uVar17 & 0x30) == 0 && plVar23[9] == 0)) goto LAB_005725fd;
    if (((local_138 & 0x11) != 0) && (plVar23[6] == 0)) {
      pcVar14 = *(char **)((long)plVar23 + (ulong)(uVar17 & 0x10) * 4 + 0x18);
      pcVar22 = pcVar24;
      if (pcVar24 == (char *)0x0) {
        pcVar22 = "application/octet-stream";
      }
      if (pcVar14 != (char *)0x0) {
        lVar21 = 8;
        do {
          sVar12 = strlen(pcVar14);
          pcVar1 = *(char **)((long)&Curl_handler_file.protocol + lVar21);
          sVar13 = strlen(pcVar1);
          if ((sVar13 <= sVar12) &&
             (iVar8 = curl_strequal(pcVar14 + (sVar12 - sVar13),pcVar1), iVar8 != 0)) {
            pcVar22 = *(char **)((long)&ContentTypeForFilename_ctts + lVar21);
            break;
          }
          lVar21 = lVar21 + 0x10;
        } while (lVar21 != 0x68);
      }
      pcVar14 = (*p_Var7)(pcVar22);
      plVar23[6] = (long)pcVar14;
      if (pcVar14 != (char *)0x0) {
        *(undefined1 *)(plVar23 + 7) = 1;
        local_138 = plVar23[8];
        goto LAB_005723f9;
      }
LAB_005725f8:
      CVar20 = CURL_FORMADD_MEMORY;
      goto LAB_005725fd;
    }
LAB_005723f9:
    if (plVar23 == plVar9 && (local_138 & 4) == 0) {
      CVar20 = CURL_FORMADD_MEMORY;
      if ((char *)*plVar23 == (char *)0x0) goto LAB_005725fd;
      pcVar14 = memdup((char *)*plVar23,plVar23[2]);
      *plVar23 = (long)pcVar14;
      if (pcVar14 == (char *)0x0) goto LAB_005725fd;
      *(undefined1 *)(plVar23 + 1) = 1;
      local_138 = plVar23[8];
    }
    local_130 = (char *)plVar23[3];
    local_128 = plVar23[5];
    if ((local_138 & 0x6b) == 0) {
      local_130 = memdup(local_130,local_128);
      plVar23[3] = (long)local_130;
      if (local_130 == (char *)0x0) goto LAB_005725f8;
      *(undefined1 *)(plVar23 + 4) = 1;
      local_128 = plVar23[5];
      local_138 = plVar23[8];
    }
    pcVar14 = (char *)*plVar23;
    sVar12 = plVar23[2];
    pcVar22 = (char *)plVar23[9];
    lVar21 = plVar23[10];
    pcVar1 = (char *)plVar23[6];
    pcVar2 = (curl_slist *)plVar23[0xe];
    pcVar3 = (char *)plVar23[0xb];
    pvVar4 = (void *)plVar23[0xd];
    pcVar15 = (curl_httppost *)(*Curl_ccalloc)(1,0x68);
    if (pcVar15 == (curl_httppost *)0x0) {
      CVar20 = CURL_FORMADD_MEMORY;
      goto LAB_005725fd;
    }
    pcVar15->name = pcVar14;
    if (pcVar14 == (char *)0x0) {
      sVar12 = 0;
    }
    else if (sVar12 == 0) {
      sVar12 = strlen(pcVar14);
    }
    pcVar15->namelength = sVar12;
    pcVar15->contents = local_130;
    pcVar15->contentslength = local_128;
    pcVar15->buffer = pcVar22;
    pcVar15->bufferlength = lVar21;
    pcVar15->contenttype = pcVar1;
    pcVar15->contentheader = pcVar2;
    pcVar15->showfilename = pcVar3;
    pcVar15->userp = pvVar4;
    pcVar15->flags = local_138;
    if (pcVar16 == (curl_httppost *)0x0) {
      pcVar16 = *last_post;
      if (*last_post == (curl_httppost *)0x0) {
        pcVar16 = (curl_httppost *)httppost;
      }
      pcVar16->next = pcVar15;
      ppcVar19 = last_post;
    }
    else {
      pcVar15->more = pcVar16->more;
      ppcVar19 = &pcVar16->more;
    }
    *ppcVar19 = pcVar15;
    if ((char *)plVar23[6] != (char *)0x0) {
      pcVar24 = (char *)plVar23[6];
    }
    plVar23 = (long *)plVar23[0xf];
    CVar20 = CURL_FORMADD_OK;
    pcVar16 = pcVar15;
    if (plVar23 == (long *)0x0) goto LAB_00572270;
    goto LAB_005722b2;
  }
  if (plVar23[3] != 0 || pcVar16 != (curl_httppost *)0x0) goto LAB_005722d1;
LAB_005725e3:
  CVar20 = CURL_FORMADD_INCOMPLETE;
LAB_005725fd:
  do {
    if ((char)plVar23[1] == '\x01') {
      if ((void *)*plVar23 != (void *)0x0) {
        (*Curl_cfree)((void *)*plVar23);
        *plVar23 = 0;
      }
      *(undefined1 *)(plVar23 + 1) = 0;
    }
    if ((char)plVar23[4] == '\x01') {
      if ((void *)plVar23[3] != (void *)0x0) {
        (*Curl_cfree)((void *)plVar23[3]);
        plVar23[3] = 0;
      }
      *(undefined1 *)(plVar23 + 4) = 0;
    }
    if ((char)plVar23[7] == '\x01') {
      if ((void *)plVar23[6] != (void *)0x0) {
        (*Curl_cfree)((void *)plVar23[6]);
        plVar23[6] = 0;
      }
      *(undefined1 *)(plVar23 + 7) = 0;
    }
    if ((char)plVar23[0xc] == '\x01') {
      if ((void *)plVar23[0xb] != (void *)0x0) {
        (*Curl_cfree)((void *)plVar23[0xb]);
        plVar23[0xb] = 0;
      }
      *(undefined1 *)(plVar23 + 0xc) = 0;
    }
    plVar23 = (long *)plVar23[0xf];
  } while (plVar23 != (long *)0x0);
LAB_00572270:
  do {
    plVar23 = (long *)plVar9[0xf];
    (*Curl_cfree)(plVar9);
    plVar9 = plVar23;
  } while (plVar23 != (long *)0x0);
  return CVar20;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}